

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ricecomp.c
# Opt level: O1

int output_nbits(Buffer *buffer,int bits,int n)

{
  Buffer_t *pBVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  
  uVar4 = buffer->bitbuffer;
  iVar3 = buffer->bits_to_go;
  if (0x20 < iVar3 + n) {
    n = n - iVar3;
    uVar4 = uVar4 << ((byte)iVar3 & 0x1f) | bits >> ((byte)n & 0x1f) & output_nbits::mask[iVar3];
    pBVar1 = buffer->current;
    buffer->current = pBVar1 + 1;
    *pBVar1 = (Buffer_t)uVar4;
    iVar3 = 8;
  }
  uVar4 = bits & output_nbits::mask[n] | uVar4 << ((byte)n & 0x1f);
  iVar5 = iVar3 - n;
  if (iVar5 == 0 || iVar3 < n) {
    iVar3 = n - iVar3;
    iVar6 = iVar5;
    do {
      pBVar1 = buffer->current;
      buffer->current = pBVar1 + 1;
      *pBVar1 = (Buffer_t)((int)uVar4 >> ((byte)iVar3 & 0x1f));
      iVar5 = iVar6 + 8;
      iVar3 = iVar3 + -8;
      bVar2 = iVar6 < -7;
      iVar6 = iVar5;
    } while (bVar2);
  }
  buffer->bitbuffer = uVar4;
  buffer->bits_to_go = iVar5;
  return iVar5;
}

Assistant:

static int output_nbits(Buffer *buffer, int bits, int n)
{
/* local copies */
int lbitbuffer;
int lbits_to_go;
    /* AND mask for the right-most n bits */
    static unsigned int mask[33] = 
         {0,
	  0x1,       0x3,       0x7,       0xf,       0x1f,       0x3f,       0x7f,       0xff,
	  0x1ff,     0x3ff,     0x7ff,     0xfff,     0x1fff,     0x3fff,     0x7fff,     0xffff,
	  0x1ffff,   0x3ffff,   0x7ffff,   0xfffff,   0x1fffff,   0x3fffff,   0x7fffff,   0xffffff,
	  0x1ffffff, 0x3ffffff, 0x7ffffff, 0xfffffff, 0x1fffffff, 0x3fffffff, 0x7fffffff, 0xffffffff};

    /*
     * insert bits at end of bitbuffer
     */
    lbitbuffer = buffer->bitbuffer;
    lbits_to_go = buffer->bits_to_go;
    if (lbits_to_go+n > 32) {
	/*
	 * special case for large n: put out the top lbits_to_go bits first
	 * note that 0 < lbits_to_go <= 8
	 */
	lbitbuffer <<= lbits_to_go;
/*	lbitbuffer |= (bits>>(n-lbits_to_go)) & ((1<<lbits_to_go)-1); */
	lbitbuffer |= (bits>>(n-lbits_to_go)) & *(mask+lbits_to_go);
	putcbuf(lbitbuffer & 0xff,buffer);
	n -= lbits_to_go;
	lbits_to_go = 8;
    }
    lbitbuffer <<= n;
/*    lbitbuffer |= ( bits & ((1<<n)-1) ); */
    lbitbuffer |= ( bits & *(mask+n) );
    lbits_to_go -= n;
    while (lbits_to_go <= 0) {
	/*
	 * bitbuffer full, put out top 8 bits
	 */
	putcbuf((lbitbuffer>>(-lbits_to_go)) & 0xff,buffer);
	lbits_to_go += 8;
    }
    buffer->bitbuffer = lbitbuffer;
    buffer->bits_to_go = lbits_to_go;
    return(0);
}